

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

void av1_update_level_info(AV1_COMP *cpi,size_t size,int64_t ts_start,int64_t ts_end)

{
  double dVar1;
  BITSTREAM_PROFILE profile;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  AV1_PRIMARY *pAVar7;
  SequenceHeader *pSVar8;
  AV1LevelInfo *level_info;
  SequenceHeader *pSVar9;
  bool bVar10;
  int frames_in_pool;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  TARGET_LEVEL_FAIL_ID TVar15;
  uint uVar16;
  FRAME_BUFFER *pFVar17;
  int iVar18;
  int iVar19;
  int *piVar20;
  long lVar21;
  size_t sVar22;
  int iVar23;
  int iVar24;
  FRAME_BUFFER *pFVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  DFG_INTERVAL *pDVar30;
  int *piVar31;
  int iVar32;
  uint uVar33;
  DECODER_MODEL *decoder_model;
  uint uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  double *pdVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int *piVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  
  iVar14 = (cpi->common).superres_upscaled_width;
  iVar4 = (cpi->common).width;
  iVar5 = (cpi->common).height;
  uVar6 = (cpi->common).tiles.cols;
  iVar13 = (cpi->common).tiles.rows;
  if ((long)iVar13 < 1) {
    iVar12 = 0;
    uVar34 = 1;
    iVar36 = 0x7fffffff;
    iVar40 = 0x7fffffff;
    iVar41 = 0;
  }
  else {
    piVar42 = &(cpi->tile_data->tile_info).mi_col_end;
    uVar34 = 1;
    iVar36 = 0x7fffffff;
    lVar27 = 0;
    iVar12 = 0;
    iVar40 = 0x7fffffff;
    iVar41 = 0;
    do {
      if (0 < (int)uVar6) {
        lVar21 = 0;
        do {
          iVar24 = *(int *)((long)piVar42 + lVar21 + -4);
          iVar32 = *(int *)((long)piVar42 + lVar21) - iVar24;
          iVar39 = *(int *)((long)piVar42 + lVar21 + -0xc);
          iVar11 = (*(int *)((long)piVar42 + lVar21 + -8) - iVar39) * iVar32 * 0x10;
          if (iVar11 < iVar12) {
            iVar11 = iVar12;
          }
          iVar12 = iVar11;
          iVar23 = (uint)(cpi->common).superres_scale_denominator * 4 * iVar32;
          iVar11 = iVar23 + 7;
          if (-1 < iVar23) {
            iVar11 = iVar23;
          }
          iVar23 = iVar11 >> 3;
          if (iVar11 >> 3 < iVar41) {
            iVar23 = iVar41;
          }
          iVar41 = iVar23;
          iVar24 = iVar4 + iVar24 * -4;
          iVar39 = iVar5 + iVar39 * -4;
          if (iVar36 < iVar24) {
            iVar24 = iVar36;
          }
          iVar36 = iVar24;
          if (iVar40 < iVar39) {
            iVar39 = iVar40;
          }
          iVar40 = iVar39;
          uVar26 = (int)((uint)(iVar4 != iVar14) << 4 | 0xf) < iVar32 & uVar34;
          if (*(int *)((long)piVar42 + lVar21) == (cpi->common).mi_params.mi_cols) {
            uVar26 = uVar34;
          }
          uVar34 = uVar26;
          lVar21 = lVar21 + 0x5d10;
        } while ((ulong)uVar6 * 0x5d10 != lVar21);
      }
      lVar27 = lVar27 + 1;
      piVar42 = piVar42 + (ulong)uVar6 * 0x1744;
    } while (lVar27 != iVar13);
  }
  pAVar7 = cpi->ppi;
  iVar24 = cpi->frame_header_count;
  iVar39 = (cpi->common).show_frame;
  iVar11 = (cpi->common).show_existing_frame;
  dVar43 = av1_get_compression_ratio(&cpi->common,size);
  pSVar8 = (cpi->common).seq_params;
  if (-1 < pSVar8->operating_points_cnt_minus_1) {
    piVar42 = &(cpi->common).superres_upscaled_width;
    iVar13 = iVar13 * uVar6;
    iVar14 = iVar14 * iVar5;
    profile = pSVar8->profile;
    bVar2 = pSVar8->still_picture;
    auVar45._8_4_ = (int)(size >> 0x20);
    auVar45._0_8_ = size;
    auVar45._12_4_ = 0x45300000;
    uVar26 = 1 << ((char)(cpi->common).spatial_layer_id + 8U & 0x1f) |
             1 << ((byte)(cpi->common).temporal_layer_id & 0x1f);
    lVar27 = 0;
    do {
      if (((pSVar8->operating_point_idc[lVar27] == 0) ||
          ((pSVar8->operating_point_idc[lVar27] & uVar26) == uVar26)) &&
         (((pAVar7->level_params).keep_level_stats >> ((uint)lVar27 & 0x1f) & 1) != 0)) {
        level_info = (pAVar7->level_params).level_info[lVar27];
        iVar32 = (level_info->level_stats).max_tile_size;
        iVar23 = (level_info->level_stats).max_superres_tile_width;
        if (iVar32 <= iVar12) {
          iVar32 = iVar12;
        }
        (level_info->level_stats).max_tile_size = iVar32;
        if (iVar23 <= iVar41) {
          iVar23 = iVar41;
        }
        (level_info->level_stats).max_superres_tile_width = iVar23;
        iVar32 = (level_info->level_stats).min_cropped_tile_width;
        if (iVar36 <= iVar32) {
          iVar32 = iVar36;
        }
        (level_info->level_stats).min_cropped_tile_width = iVar32;
        iVar32 = (level_info->level_stats).min_cropped_tile_height;
        if (iVar40 <= iVar32) {
          iVar32 = iVar40;
        }
        (level_info->level_stats).min_cropped_tile_height = iVar32;
        piVar31 = &(level_info->level_stats).tile_width_is_valid;
        *piVar31 = *piVar31 & uVar34;
        iVar32 = (level_info->level_stats).min_frame_width;
        if (iVar4 <= iVar32) {
          iVar32 = iVar4;
        }
        (level_info->level_stats).min_frame_width = iVar32;
        iVar32 = (level_info->level_stats).min_frame_height;
        if (iVar5 <= iVar32) {
          iVar32 = iVar5;
        }
        (level_info->level_stats).min_frame_height = iVar32;
        dVar44 = (level_info->level_stats).min_cr;
        if (dVar43 <= dVar44) {
          dVar44 = dVar43;
        }
        (level_info->level_stats).min_cr = dVar44;
        (level_info->level_stats).total_compressed_size =
             (level_info->level_stats).total_compressed_size +
             (auVar45._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0);
        iVar32 = (level_info->level_spec).max_picture_size;
        if (iVar32 <= iVar14) {
          iVar32 = iVar14;
        }
        (level_info->level_spec).max_picture_size = iVar32;
        iVar32 = (level_info->level_spec).max_h_size;
        iVar23 = *piVar42;
        if (iVar23 < iVar32) {
          iVar23 = iVar32;
        }
        (level_info->level_spec).max_h_size = iVar23;
        iVar32 = (level_info->level_spec).max_v_size;
        if (iVar32 <= iVar5) {
          iVar32 = iVar5;
        }
        (level_info->level_spec).max_v_size = iVar32;
        uVar16 = (level_info->level_spec).max_tile_cols;
        if ((int)uVar16 <= (int)uVar6) {
          uVar16 = uVar6;
        }
        (level_info->level_spec).max_tile_cols = uVar16;
        iVar32 = (level_info->level_spec).max_tiles;
        if (iVar32 <= iVar13) {
          iVar32 = iVar13;
        }
        (level_info->level_spec).max_tiles = iVar32;
        iVar32 = (level_info->frame_window_buffer).num;
        if (iVar32 < 0x100) {
          (level_info->frame_window_buffer).num = iVar32 + 1;
          iVar19 = (level_info->frame_window_buffer).start;
          iVar23 = iVar32;
          iVar32 = iVar32 + 1;
        }
        else {
          iVar23 = (level_info->frame_window_buffer).start;
          uVar16 = iVar23 + 0x100;
          if (-1 < (int)(iVar23 + 1U)) {
            uVar16 = iVar23 + 1U;
          }
          iVar19 = (iVar23 - (uVar16 & 0xffffff00)) + 1;
          (level_info->frame_window_buffer).start = iVar19;
          iVar23 = iVar32 + -1;
        }
        uVar33 = iVar23 + iVar19;
        uVar16 = iVar23 + 0xff + iVar19;
        if (-1 < (int)uVar33) {
          uVar16 = uVar33;
        }
        iVar23 = uVar33 - (uVar16 & 0xffffff00);
        (level_info->frame_window_buffer).buf[iVar23].ts_start = ts_start;
        (level_info->frame_window_buffer).buf[iVar23].ts_end = ts_end;
        (level_info->frame_window_buffer).buf[iVar23].encoded_size_in_bytes = size;
        (level_info->frame_window_buffer).buf[iVar23].pic_size = iVar14;
        (level_info->frame_window_buffer).buf[iVar23].frame_header_count = iVar24;
        (level_info->frame_window_buffer).buf[iVar23].tiles = iVar13;
        (level_info->frame_window_buffer).buf[iVar23].show_frame = iVar39;
        (level_info->frame_window_buffer).buf[iVar23].show_existing_frame = iVar11;
        if (iVar39 != 0) {
          uVar33 = (iVar19 + iVar32) - 1;
          uVar16 = iVar19 + iVar32 + 0xfe;
          if (-1 < (int)uVar33) {
            uVar16 = uVar33;
          }
          iVar23 = uVar33 - (uVar16 & 0xffffff00);
          lVar21 = (level_info->frame_window_buffer).buf[iVar23].ts_end;
          if (lVar21 < 0x989681) {
            lVar21 = 10000000;
          }
          iVar18 = 1;
          iVar19 = iVar18;
          if (1 < iVar32) {
            iVar35 = iVar23;
            do {
              bVar10 = iVar35 < 1;
              iVar35 = iVar35 + -1;
              if (bVar10) {
                iVar35 = 0xff;
              }
            } while ((((level_info->frame_window_buffer).buf[iVar35].show_frame == 0) ||
                     (iVar19 = iVar18,
                     lVar21 + -10000000 <= (level_info->frame_window_buffer).buf[iVar35].ts_start))
                    && (iVar18 = iVar18 + 1, iVar19 = iVar32, iVar32 != iVar18));
          }
          if (iVar32 < iVar19) {
            iVar19 = iVar32;
          }
          if (iVar32 < 1) {
            iVar32 = 0;
            iVar18 = 0;
            lVar37 = 0;
            lVar21 = 0;
            uVar29 = 0;
          }
          else {
            lVar28 = 0;
            lVar21 = 0;
            lVar37 = 0;
            iVar18 = 0;
            iVar32 = 0;
            do {
              if ((level_info->frame_window_buffer).buf[iVar23].show_existing_frame == 0) {
                iVar32 = iVar32 + (level_info->frame_window_buffer).buf[iVar23].frame_header_count;
                lVar21 = lVar21 + (level_info->frame_window_buffer).buf[iVar23].pic_size;
              }
              if ((level_info->frame_window_buffer).buf[iVar23].show_frame != 0) {
                lVar37 = lVar37 + (level_info->frame_window_buffer).buf[iVar23].pic_size;
              }
              iVar18 = iVar18 + (level_info->frame_window_buffer).buf[iVar23].tiles;
              lVar28 = lVar28 + (level_info->frame_window_buffer).buf[iVar23].encoded_size_in_bytes;
              bVar10 = iVar23 < 1;
              iVar23 = iVar23 + -1;
              if (bVar10) {
                iVar23 = 0xff;
              }
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
            uVar29 = lVar28 * 8;
          }
          iVar23 = (level_info->level_stats).max_bitrate;
          iVar19 = (level_info->level_spec).max_header_rate;
          if (iVar32 < iVar19) {
            iVar32 = iVar19;
          }
          (level_info->level_spec).max_header_rate = iVar32;
          lVar28 = (level_info->level_spec).max_display_rate;
          if (lVar37 < lVar28) {
            lVar37 = lVar28;
          }
          (level_info->level_spec).max_display_rate = lVar37;
          lVar37 = (level_info->level_spec).max_decode_rate;
          if (lVar21 < lVar37) {
            lVar21 = lVar37;
          }
          (level_info->level_spec).max_decode_rate = lVar21;
          iVar32 = (level_info->level_spec).max_tile_rate;
          if (iVar18 < iVar32) {
            iVar18 = iVar32;
          }
          (level_info->level_spec).max_tile_rate = iVar18;
          if (0x7ffffffe < uVar29) {
            uVar29 = 0x7fffffff;
          }
          iVar32 = (int)uVar29;
          if ((int)uVar29 < iVar23) {
            iVar32 = iVar23;
          }
          (level_info->level_stats).max_bitrate = iVar32;
          (level_info->level_stats).total_time_encoded =
               (double)((cpi->time_stamps).prev_ts_end - (cpi->time_stamps).prev_ts_start) /
               10000000.0 + (level_info->level_stats).total_time_encoded;
        }
        pdVar38 = &level_info->decoder_models[0].frame_buffer_pool[0].presentation_time;
        pFVar25 = level_info->decoder_models[0].frame_buffer_pool;
        lVar21 = 0;
        do {
          if (level_info->decoder_models[lVar21].status == '\0') {
            decoder_model = level_info->decoder_models + lVar21;
            iVar32 = (cpi->common).show_existing_frame;
            iVar19 = (cpi->common).height * (cpi->common).superres_upscaled_width;
            iVar23 = (cpi->common).show_frame;
            decoder_model->num_frame = decoder_model->num_frame + 1;
            if (iVar32 == 0) {
              decoder_model->num_decoded_frame = decoder_model->num_decoded_frame + 1;
            }
            if (iVar23 != 0 || iVar32 != 0) {
              decoder_model->num_shown_frame = decoder_model->num_shown_frame + 1;
            }
            sVar22 = decoder_model->coded_bits + size * 8;
            decoder_model->coded_bits = sVar22;
            if (iVar32 == 0) {
              iVar18 = decoder_model->decoder_buffer_delay;
              dVar44 = get_removal_time((uint)decoder_model->mode,decoder_model->num_decoded_frame,
                                        iVar18,decoder_model->frame_buffer_pool,
                                        decoder_model->current_time);
              if (dVar44 < 0.0) {
                decoder_model->status = '\x02';
              }
              else {
                dVar47 = decoder_model->removal_time;
                decoder_model->removal_time = dVar44;
                dVar46 = (double)decoder_model->decode_samples / (dVar44 - dVar47);
                decoder_model->decode_samples = iVar19;
                dVar47 = decoder_model->max_decode_rate;
                if (decoder_model->max_decode_rate <= dVar46) {
                  dVar47 = dVar46;
                }
                decoder_model->max_decode_rate = dVar47;
                dVar46 = (double)(iVar18 + decoder_model->encoder_buffer_delay) / -90000.0 + dVar44;
                dVar47 = decoder_model->last_bit_arrival_time;
                if (decoder_model->last_bit_arrival_time <= dVar46) {
                  dVar47 = dVar46;
                }
                decoder_model->first_bit_arrival_time = dVar47;
                auVar49._8_4_ = (int)(sVar22 >> 0x20);
                auVar49._0_8_ = sVar22;
                auVar49._12_4_ = 0x45300000;
                dVar46 = ((auVar49._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar22) - 4503599627370496.0)) /
                         decoder_model->bit_rate + dVar47;
                decoder_model->last_bit_arrival_time = dVar46;
                if ((dVar46 <= dVar44) || (decoder_model->is_low_delay_mode != false)) {
                  decoder_model->coded_bits = 0;
                  uVar16 = (decoder_model->dfg_interval_queue).head;
                  uVar29 = (ulong)(int)uVar16;
                  dVar48 = (decoder_model->dfg_interval_queue).buf[uVar29].removal_time;
                  iVar18 = (decoder_model->dfg_interval_queue).size;
                  if (dVar48 <= dVar46) {
                    pDVar30 = (decoder_model->dfg_interval_queue).buf + uVar29;
                    do {
                      uVar16 = (uint)uVar29;
                      if (iVar18 < 1) break;
                      dVar1 = (decoder_model->dfg_interval_queue).total_interval;
                      if (1.0 < (dVar48 - dVar47) + dVar1) goto LAB_001cb9e8;
                      (decoder_model->dfg_interval_queue).total_interval =
                           dVar1 - (pDVar30->last_bit_arrival_time - pDVar30->first_bit_arrival_time
                                   );
                      uVar33 = uVar16 + 0x40;
                      if (-1 < (int)(uVar16 + 1)) {
                        uVar33 = uVar16 + 1;
                      }
                      uVar16 = (uVar16 - (uVar33 & 0xffffffc0)) + 1;
                      uVar29 = (ulong)uVar16;
                      (decoder_model->dfg_interval_queue).head = uVar16;
                      iVar18 = iVar18 + -1;
                      (decoder_model->dfg_interval_queue).size = iVar18;
                      pDVar30 = (decoder_model->dfg_interval_queue).buf + (int)uVar16;
                      dVar48 = pDVar30->removal_time;
                    } while (dVar48 <= dVar46);
                  }
                  (decoder_model->dfg_interval_queue).size = iVar18 + 1;
                  uVar33 = uVar16 + iVar18;
                  uVar16 = uVar16 + 0x3f + iVar18;
                  if (-1 < (int)uVar33) {
                    uVar16 = uVar33;
                  }
                  iVar18 = uVar33 - (uVar16 & 0xffffffc0);
                  (decoder_model->dfg_interval_queue).buf[iVar18].first_bit_arrival_time = dVar47;
                  (decoder_model->dfg_interval_queue).buf[iVar18].last_bit_arrival_time = dVar46;
                  (decoder_model->dfg_interval_queue).buf[iVar18].removal_time = dVar44;
                  dVar47 = (dVar46 - dVar47) + (decoder_model->dfg_interval_queue).total_interval;
                  (decoder_model->dfg_interval_queue).total_interval = dVar47;
                  if (dVar47 <= 1.0) {
                    lVar37 = 0;
                    do {
                      if ((((0 < *(int *)((long)pdVar38 + lVar37 + -0xc)) &&
                           (0.0 <= *(double *)((long)pdVar38 + lVar37))) &&
                          (*(double *)((long)pdVar38 + lVar37) <= dVar44)) &&
                         (*(undefined4 *)((long)pdVar38 + lVar37 + -0xc) = 0,
                         *(int *)((long)pdVar38 + lVar37 + -0x10) == 0)) {
                        *(undefined4 *)((long)pdVar38 + lVar37 + -8) = 0xffffffff;
                        *(undefined8 *)((long)pdVar38 + lVar37) = 0xbff0000000000000;
                      }
                      lVar37 = lVar37 + 0x18;
                    } while (lVar37 != 0xf0);
                    bVar3 = (cpi->common).current_frame.frame_type;
                    piVar20 = &(cpi->common).height;
                    piVar31 = piVar42;
                    if ((bVar3 & 0xfd) != 0) {
                      pSVar9 = (cpi->common).seq_params;
                      piVar31 = &pSVar9->max_frame_width;
                      piVar20 = &pSVar9->max_frame_height;
                    }
                    decoder_model->current_time =
                         dVar44 + (double)(*piVar20 * *piVar31) / (double)decoder_model->decode_rate
                    ;
                    lVar37 = 0;
                    pFVar17 = pFVar25;
                    do {
                      if ((pFVar17->decoder_ref_count == 0) && (pFVar17->player_ref_count == 0)) {
                        pFVar17->frame_type = bVar3;
                        update_ref_buffers(decoder_model,(int)lVar37,
                                           (cpi->common).current_frame.refresh_frame_flags);
                        if (decoder_model->initial_presentation_delay <= 0.0 &&
                            decoder_model->initial_presentation_delay != 0.0) {
                          lVar28 = 0;
                          iVar18 = 0;
                          do {
                            if ((0 < *(int *)((long)&pFVar25->decoder_ref_count + lVar28)) ||
                               (0 < *(int *)((long)&pFVar25->player_ref_count + lVar28))) {
                              iVar18 = iVar18 + 1;
                            }
                            lVar28 = lVar28 + 0x18;
                          } while (lVar28 != 0xf0);
                          if (decoder_model->initial_display_delay + -1 <= iVar18) {
                            dVar44 = decoder_model->current_time;
                            decoder_model->initial_presentation_delay = dVar44;
                            lVar28 = 0;
                            do {
                              if (*(int *)((long)pdVar38 + lVar28 + -0xc) != 0) {
                                dVar47 = -1.0;
                                if ((decoder_model->mode != '\x01') &&
                                   (dVar47 = -1.0, 0.0 <= dVar44)) {
                                  dVar47 = (double)(decoder_model->num_ticks_per_picture *
                                                   *(int *)((long)pdVar38 + lVar28 + -8)) *
                                           decoder_model->display_clock_tick + dVar44;
                                }
                                *(double *)((long)pdVar38 + lVar28) = dVar47;
                              }
                              lVar28 = lVar28 + 0x18;
                            } while (lVar28 != 0xf0);
                          }
                        }
                        goto LAB_001cb71e;
                      }
                      lVar37 = lVar37 + 1;
                      pFVar17 = pFVar17 + 1;
                    } while (lVar37 != 10);
                    decoder_model->status = '\x02';
                  }
                  else {
LAB_001cb9e8:
                    decoder_model->status = '\x06';
                  }
                }
                else {
                  decoder_model->status = '\x05';
                }
              }
            }
            else {
              lVar37 = (long)decoder_model->vbi[cpi->existing_fb_idx_to_show];
              if (lVar37 < 0) {
                decoder_model->status = '\x03';
              }
              else {
                if (decoder_model->frame_buffer_pool[lVar37].frame_type == '\0') {
                  update_ref_buffers(decoder_model,decoder_model->vbi[cpi->existing_fb_idx_to_show],
                                     0xff);
                }
LAB_001cb71e:
                if (iVar23 != 0 || iVar32 != 0) {
                  iVar23 = (int)lVar37;
                  piVar31 = &decoder_model->frame_buffer_pool[iVar23].player_ref_count;
                  *piVar31 = *piVar31 + 1;
                  iVar32 = decoder_model->num_shown_frame;
                  decoder_model->frame_buffer_pool[iVar23].display_index = iVar32;
                  if ((decoder_model->mode == '\x01') ||
                     (decoder_model->initial_presentation_delay < 0.0)) {
                    decoder_model->frame_buffer_pool[iVar23].presentation_time = -1.0;
                    dVar44 = -1.0;
                  }
                  else {
                    dVar44 = (double)(iVar32 * decoder_model->num_ticks_per_picture) *
                             decoder_model->display_clock_tick +
                             decoder_model->initial_presentation_delay;
                    decoder_model->frame_buffer_pool[iVar23].presentation_time = dVar44;
                    if (0.0 <= dVar44) {
                      if (decoder_model->current_time <= dVar44) {
                        iVar32 = decoder_model->display_samples;
                        dVar47 = decoder_model->presentation_time;
                        decoder_model->display_samples = iVar19;
                        decoder_model->presentation_time = dVar44;
                        if (0.0 <= dVar47) {
                          dVar47 = (double)iVar32 / (dVar44 - dVar47);
                          dVar44 = decoder_model->max_display_rate;
                          if (decoder_model->max_display_rate <= dVar47) {
                            dVar44 = dVar47;
                          }
                          decoder_model->max_display_rate = dVar44;
                        }
                      }
                      else {
                        decoder_model->status = '\x04';
                      }
                      goto LAB_001cb650;
                    }
                  }
                  decoder_model->display_samples = iVar19;
                  decoder_model->presentation_time = dVar44;
                }
              }
            }
          }
LAB_001cb650:
          lVar21 = lVar21 + 1;
          pdVar38 = pdVar38 + 0xf6;
          pFVar25 = pFVar25 + 0x52;
        } while (lVar21 != 0x1c);
        bVar3 = (pAVar7->level_params).target_seq_level_idx[lVar27];
        if (((bVar3 < 0x1c) && ((cpi->oxcf).strict_level_conformance != 0)) &&
           (TVar15 = check_level_constraints
                               (level_info,bVar3,(uint)pSVar8->tier[lVar27],(uint)bVar2,profile,0),
           TVar15 != TARGET_LEVEL_OK)) {
          aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,
                             "Failed to encode to the target level %d_%d. %s",
                             (ulong)((bVar3 >> 2) + 2),(ulong)(bVar3 & 3),
                             level_fail_messages_rel +
                             *(int *)(level_fail_messages_rel + (ulong)TVar15 * 4));
        }
      }
      bVar10 = lVar27 < pSVar8->operating_points_cnt_minus_1;
      lVar27 = lVar27 + 1;
    } while (bVar10);
  }
  return;
}

Assistant:

void av1_update_level_info(AV1_COMP *cpi, size_t size, int64_t ts_start,
                           int64_t ts_end) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1LevelParams *const level_params = &cpi->ppi->level_params;

  const int upscaled_width = cm->superres_upscaled_width;
  const int width = cm->width;
  const int height = cm->height;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int tiles = tile_cols * tile_rows;
  const int luma_pic_size = upscaled_width * height;
  const int frame_header_count = cpi->frame_header_count;
  const int show_frame = cm->show_frame;
  const int show_existing_frame = cm->show_existing_frame;

  int max_tile_size;
  int min_cropped_tile_width;
  int min_cropped_tile_height;
  int max_superres_tile_width;
  int tile_width_is_valid;
  get_tile_stats(cm, cpi->tile_data, &max_tile_size, &max_superres_tile_width,
                 &min_cropped_tile_width, &min_cropped_tile_height,
                 &tile_width_is_valid);

  const double compression_ratio = av1_get_compression_ratio(cm, size);

  const int temporal_layer_id = cm->temporal_layer_id;
  const int spatial_layer_id = cm->spatial_layer_id;
  const SequenceHeader *const seq_params = cm->seq_params;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  const int is_still_picture = seq_params->still_picture;
  // update level_stats
  // TODO(kyslov@) fix the implementation according to buffer model
  for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; ++i) {
    if (!is_in_operating_point(seq_params->operating_point_idc[i],
                               temporal_layer_id, spatial_layer_id) ||
        !((level_params->keep_level_stats >> i) & 1)) {
      continue;
    }

    AV1LevelInfo *const level_info = level_params->level_info[i];
    assert(level_info != NULL);
    AV1LevelStats *const level_stats = &level_info->level_stats;

    level_stats->max_tile_size =
        AOMMAX(level_stats->max_tile_size, max_tile_size);
    level_stats->max_superres_tile_width =
        AOMMAX(level_stats->max_superres_tile_width, max_superres_tile_width);
    level_stats->min_cropped_tile_width =
        AOMMIN(level_stats->min_cropped_tile_width, min_cropped_tile_width);
    level_stats->min_cropped_tile_height =
        AOMMIN(level_stats->min_cropped_tile_height, min_cropped_tile_height);
    level_stats->tile_width_is_valid &= tile_width_is_valid;
    level_stats->min_frame_width = AOMMIN(level_stats->min_frame_width, width);
    level_stats->min_frame_height =
        AOMMIN(level_stats->min_frame_height, height);
    level_stats->min_cr = AOMMIN(level_stats->min_cr, compression_ratio);
    level_stats->total_compressed_size += (double)size;

    // update level_spec
    // TODO(kyslov@) update all spec fields
    AV1LevelSpec *const level_spec = &level_info->level_spec;
    level_spec->max_picture_size =
        AOMMAX(level_spec->max_picture_size, luma_pic_size);
    level_spec->max_h_size =
        AOMMAX(level_spec->max_h_size, cm->superres_upscaled_width);
    level_spec->max_v_size = AOMMAX(level_spec->max_v_size, height);
    level_spec->max_tile_cols = AOMMAX(level_spec->max_tile_cols, tile_cols);
    level_spec->max_tiles = AOMMAX(level_spec->max_tiles, tiles);

    // Store info. of current frame into FrameWindowBuffer.
    FrameWindowBuffer *const buffer = &level_info->frame_window_buffer;
    store_frame_record(ts_start, ts_end, size, luma_pic_size,
                       frame_header_count, tiles, show_frame,
                       show_existing_frame, buffer);
    if (show_frame) {
      // Count the number of frames encoded in the past 1 second.
      const int encoded_frames_in_last_second =
          show_frame ? count_frames(buffer, TICKS_PER_SEC) : 0;
      scan_past_frames(buffer, encoded_frames_in_last_second, level_spec,
                       level_stats);
      level_stats->total_time_encoded +=
          (cpi->time_stamps.prev_ts_end - cpi->time_stamps.prev_ts_start) /
          (double)TICKS_PER_SEC;
    }

    DECODER_MODEL *const decoder_models = level_info->decoder_models;
    for (AV1_LEVEL level = SEQ_LEVEL_2_0; level < SEQ_LEVELS; ++level) {
      decoder_model_process_frame(cpi, size << 3, &decoder_models[level]);
    }

    // Check whether target level is met.
    const AV1_LEVEL target_level = level_params->target_seq_level_idx[i];
    if (target_level < SEQ_LEVELS && cpi->oxcf.strict_level_conformance) {
      assert(is_valid_seq_level_idx(target_level));
      const int tier = seq_params->tier[i];
      const TARGET_LEVEL_FAIL_ID fail_id = check_level_constraints(
          level_info, target_level, tier, is_still_picture, profile, 0);
      if (fail_id != TARGET_LEVEL_OK) {
        const int target_level_major = 2 + (target_level >> 2);
        const int target_level_minor = target_level & 3;
        aom_internal_error(cm->error, AOM_CODEC_ERROR,
                           "Failed to encode to the target level %d_%d. %s",
                           target_level_major, target_level_minor,
                           level_fail_messages[fail_id]);
      }
    }
  }
}